

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patas_scan.hpp
# Opt level: O0

void __thiscall
duckdb::PatasScanState<double>::Skip
          (PatasScanState<double> *this,ColumnSegment *segment,idx_t skip_count)

{
  bool bVar1;
  PatasScanState<double> *values;
  ulong in_RDX;
  PatasScanState<double> *in_RDI;
  idx_t i;
  idx_t groups_to_skip;
  idx_t to_skip;
  idx_t in_stack_ffffffffffffffd0;
  PatasScanState<double> *this_00;
  unsigned_long *in_stack_ffffffffffffffd8;
  PatasScanState<double> *in_stack_ffffffffffffffe0;
  ulong local_18;
  
  local_18 = in_RDX;
  if ((in_RDI->total_value_count != 0) && (bVar1 = GroupFinished(in_RDI), !bVar1)) {
    in_stack_ffffffffffffffe0 = (PatasScanState<double> *)LeftInGroup(in_RDI);
    local_18 = in_RDX - (long)in_stack_ffffffffffffffe0;
    ScanGroup<unsigned_long,true>
              (in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  }
  values = (PatasScanState<double> *)(local_18 >> 10);
  for (this_00 = (PatasScanState<double> *)0x0; this_00 < values;
      this_00 = (PatasScanState<double> *)
                ((long)&(this_00->super_SegmentScanState)._vptr_SegmentScanState + 1)) {
    SkipGroup(this_00);
  }
  if (local_18 + (long)values * -0x400 != 0) {
    ScanGroup<unsigned_long,true>(in_stack_ffffffffffffffe0,(unsigned_long *)values,(idx_t)this_00);
  }
  return;
}

Assistant:

void Skip(ColumnSegment &segment, idx_t skip_count) {
		using EXACT_TYPE = typename FloatingToExact<T>::TYPE;

		if (total_value_count != 0 && !GroupFinished()) {
			// Finish skipping the current group
			idx_t to_skip = LeftInGroup();
			skip_count -= to_skip;
			ScanGroup<EXACT_TYPE, true>(nullptr, to_skip);
		}
		// Figure out how many entire groups we can skip
		// For these groups, we don't even need to process the metadata or values
		idx_t groups_to_skip = skip_count / PatasPrimitives::PATAS_GROUP_SIZE;
		for (idx_t i = 0; i < groups_to_skip; i++) {
			SkipGroup();
		}
		skip_count -= PatasPrimitives::PATAS_GROUP_SIZE * groups_to_skip;
		if (skip_count == 0) {
			return;
		}
		// For the last group that this skip (partially) touches, we do need to
		// load the metadata and values into the group_state
		ScanGroup<EXACT_TYPE, true>(nullptr, skip_count);
	}